

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynModule * ParseModule(ParseContext *ctx)

{
  LexemeType LVar1;
  Lexeme *begin;
  Lexeme *pos;
  uint uVar2;
  int iVar3;
  SynBase *node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IntrusiveList<SynModuleImport> IVar4;
  IntrusiveList<SynBase> expressions;
  TraceScope traceScope;
  IntrusiveList<SynBase> local_68;
  SynBase *local_58;
  SynBase *pSStack_50;
  TraceScope local_40;
  SynModule *this;
  
  if ((ParseModule(ParseContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&ParseModule(ParseContext&)::token), iVar3 != 0)) {
    ParseModule::token = NULLC::TraceGetToken("parser","ParseModule");
    __cxa_guard_release(&ParseModule(ParseContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&local_40,ParseModule::token);
  begin = ctx->currentLexeme;
  (ctx->statistics).finishTime = 0;
  IVar4 = ParseImports(ctx);
  uVar2 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar2;
  (ctx->statistics).finishTime = 0;
  local_68 = ParseExpressions(ctx);
  pos = ctx->currentLexeme;
  LVar1 = pos->type;
  while (LVar1 != lex_none) {
    anon_unknown.dwarf_15703::Report(ctx,pos,"ERROR: unexpected symbol");
    if (ctx->currentLexeme->type != lex_none) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    while (node = ParseExpression(ctx), node != (SynBase *)0x0) {
      IntrusiveList<SynBase>::push_back(&local_68,node);
    }
    pos = ctx->currentLexeme;
    LVar1 = pos->type;
  }
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Parse",uVar2);
  if (local_68.head == (SynBase *)0x0) {
    anon_unknown.dwarf_15703::Report(ctx,ctx->currentLexeme,"ERROR: module contains no code");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynModule *)CONCAT44(extraout_var_00,iVar3);
    local_58 = local_68.head;
    pSStack_50 = local_68.tail;
    SynBase::SynBase((SynBase *)this,0x43,begin,ctx->currentLexeme);
  }
  else {
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynModule *)CONCAT44(extraout_var,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_58 = local_68.head;
    pSStack_50 = local_68.tail;
    SynBase::SynBase((SynBase *)this,0x43,begin,ctx->currentLexeme + -1);
  }
  (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_00247f08;
  this->imports = IVar4;
  (this->expressions).head = local_58;
  (this->expressions).tail = pSStack_50;
  NULLC::TraceScope::~TraceScope(&local_40);
  return this;
}

Assistant:

SynModule* ParseModule(ParseContext &ctx)
{
	TRACE_SCOPE("parser", "ParseModule");

	Lexeme *start = ctx.currentLexeme;

	// Ignore nested import timing
	ctx.statistics.finishTime = 0;

	IntrusiveList<SynModuleImport> imports = ParseImports(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<SynBase> expressions = ParseExpressions(ctx);

	while(!ctx.Consume(lex_none))
	{
		Report(ctx, ctx.Current(), "ERROR: unexpected symbol");

		ctx.Skip();

		while(SynBase* expression = ParseExpression(ctx))
			expressions.push_back(expression);
	}

	ctx.statistics.Finish("Parse", NULLCTime::clockMicro());

	if(expressions.empty())
	{
		Report(ctx, ctx.Current(), "ERROR: module contains no code");

		return new (ctx.get<SynModule>()) SynModule(start, ctx.Current(), imports, expressions);
	}

	return new (ctx.get<SynModule>()) SynModule(start, ctx.Previous(), imports, expressions);
}